

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq_word_validation_test.c
# Opt level: O0

_Bool accept_rec(automaton *a,char *word,char *state_list)

{
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  char *__s;
  size_t fs_len_1;
  char state_list_extended_1 [1000];
  int local_444;
  int i;
  size_t fs_len;
  char state_list_extended [1000];
  int i_1;
  size_t following_states_length;
  char *following_states;
  size_t depth;
  size_t w_len;
  char *state_list_local;
  char *word_local;
  automaton *a_local;
  
  sVar2 = strlen(word);
  sVar3 = strlen(state_list);
  uVar4 = sVar3 - 1;
  if (uVar4 < sVar2) {
    __s = get_following_states(a,state_list[uVar4],word[uVar4]);
    sVar2 = strlen(__s);
    _Var1 = is_existential(a,state_list[uVar4]);
    if (_Var1) {
      state_list_extended[0x3e4] = '\0';
      state_list_extended[0x3e5] = '\0';
      state_list_extended[0x3e6] = '\0';
      state_list_extended[999] = '\0';
      for (; (int)state_list_extended._996_4_ < (int)sVar2;
          state_list_extended._996_4_ = state_list_extended._996_4_ + 1) {
        strcpy((char *)&fs_len,state_list);
        sVar3 = strlen((char *)&fs_len);
        state_list_extended[sVar3 - 8] = __s[(int)state_list_extended._996_4_];
        state_list_extended[sVar3 - 7] = '\0';
        _Var1 = accept_rec(a,word,(char *)&fs_len);
        if (_Var1) {
          return true;
        }
      }
      a_local._7_1_ = false;
    }
    else {
      for (local_444 = 0; local_444 < (int)sVar2; local_444 = local_444 + 1) {
        strcpy((char *)&fs_len_1,state_list);
        sVar3 = strlen((char *)&fs_len_1);
        state_list_extended_1[sVar3 - 8] = __s[local_444];
        state_list_extended_1[sVar3 - 7] = '\0';
        _Var1 = accept_rec(a,word,(char *)&fs_len_1);
        if (!_Var1) {
          return false;
        }
      }
      a_local._7_1_ = true;
    }
  }
  else {
    a_local._7_1_ = is_acceptable(a,state_list[uVar4]);
  }
  return a_local._7_1_;
}

Assistant:

bool accept_rec(const automaton *a, const char *word, const char *state_list) {
    size_t w_len = strlen(word);
    size_t depth = strlen(state_list)-1;

    if(depth >= w_len) {
        return is_acceptable(a, state_list[depth]);
    }
    const char * following_states = get_following_states(a, state_list[depth], word[depth]);
    size_t following_states_length = strlen(following_states);
    if(is_existential(a, state_list[depth])) {
        // need to accept_rec any of following states
        int i;
        for(i=0; i<(int)following_states_length; i++) {
            char state_list_extended[WORD_LEN_MAX]; // states list for given word is equal its length
            strcpy(state_list_extended, state_list);
            size_t fs_len = strlen(state_list_extended);
            // append one of possible following states to current state_list
            state_list_extended[fs_len] = following_states[i];
            state_list_extended[fs_len+1] = '\0';
            assert(strlen(state_list_extended) == strlen(state_list)+1);

            if(accept_rec(a, word, state_list_extended)) {
                return true;
            }
        }
        assert(i == following_states_length);
        return false; // no state_list was accepted
    }
    assert(is_universal(a, state_list[depth]));
    int i;
    for(i=0; i<(int)following_states_length; i++) {
        char state_list_extended[WORD_LEN_MAX]; // states list for given word is equal its length
        strcpy(state_list_extended, state_list);
        size_t fs_len = strlen(state_list_extended);
        // append one of possible following states to current state_list
        state_list_extended[fs_len] = following_states[i];
        state_list_extended[fs_len+1] = '\0';
        assert(strlen(state_list_extended) == strlen(state_list)+1);

        if(!accept_rec(a, word, state_list_extended)) {
            return false;
        }
    }
    assert(i == following_states_length);
    return true; // all states were accepted
}